

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

void __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::EmitBr
          (BinaryReaderInterp *this,Index depth,Index drop_count,Index keep_count)

{
  u32 val;
  Offset offset_00;
  Label *pLVar1;
  size_type sVar2;
  Offset offset;
  Index keep_count_local;
  Index drop_count_local;
  Index depth_local;
  BinaryReaderInterp *this_local;
  
  Istream::EmitDropKeep(this->istream_,drop_count,keep_count);
  pLVar1 = GetLabel(this,depth);
  val = pLVar1->offset;
  Istream::Emit(this->istream_,Br);
  if (val == 0xffffffff) {
    sVar2 = std::
            vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
            ::size(&this->label_stack_);
    offset_00 = Istream::end(this->istream_);
    FixupMap::Append(&this->depth_fixups_,((int)sVar2 + -1) - depth,offset_00);
  }
  Istream::Emit(this->istream_,val);
  return;
}

Assistant:

void BinaryReaderInterp::EmitBr(Index depth,
                                Index drop_count,
                                Index keep_count) {
  istream_.EmitDropKeep(drop_count, keep_count);
  Istream::Offset offset = GetLabel(depth)->offset;
  istream_.Emit(Opcode::Br);
  if (offset == Istream::kInvalidOffset) {
    // depth_fixups_ stores the depth counting up from zero, where zero is the
    // top-level function scope.
    depth_fixups_.Append(label_stack_.size() - 1 - depth, istream_.end());
  }
  istream_.Emit(offset);
}